

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void iterates_clear(CUPDLPiterates *iterates)

{
  if (iterates != (CUPDLPiterates *)0x0) {
    if (iterates->x[0] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->x[0]);
    }
    if (iterates->x[1] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->x[1]);
    }
    if (iterates->y[0] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->y[0]);
    }
    if (iterates->y[1] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->y[1]);
    }
    if (iterates->xSum != (cupdlp_float *)0x0) {
      free(iterates->xSum);
      iterates->xSum = (cupdlp_float *)0x0;
    }
    if (iterates->ySum != (cupdlp_float *)0x0) {
      free(iterates->ySum);
      iterates->ySum = (cupdlp_float *)0x0;
    }
    if (iterates->xAverage != (CUPDLPvec *)0x0) {
      vec_clear(iterates->xAverage);
    }
    if (iterates->yAverage != (CUPDLPvec *)0x0) {
      vec_clear(iterates->yAverage);
    }
    if (iterates->xLastRestart != (cupdlp_float *)0x0) {
      free(iterates->xLastRestart);
      iterates->xLastRestart = (cupdlp_float *)0x0;
    }
    if (iterates->yLastRestart != (cupdlp_float *)0x0) {
      free(iterates->yLastRestart);
      iterates->yLastRestart = (cupdlp_float *)0x0;
    }
    if (iterates->ax[0] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->ax[0]);
    }
    if (iterates->ax[1] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->ax[1]);
    }
    if (iterates->axAverage != (CUPDLPvec *)0x0) {
      vec_clear(iterates->axAverage);
    }
    if (iterates->aty[0] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->aty[0]);
    }
    if (iterates->aty[1] != (CUPDLPvec *)0x0) {
      vec_clear(iterates->aty[1]);
    }
    if (iterates->atyAverage != (CUPDLPvec *)0x0) {
      vec_clear(iterates->atyAverage);
    }
    free(iterates);
    return;
  }
  return;
}

Assistant:

void iterates_clear(CUPDLPiterates *iterates) {
  if (iterates) {
    if (iterates->x[0]) {
      // CUPDLP_FREE_VEC(iterates->x[0]);
      vec_clear(iterates->x[0]);
    }
    if (iterates->x[1]) {
      // CUPDLP_FREE_VEC(iterates->x[1]);
      vec_clear(iterates->x[1]);
    }
    if (iterates->y[0]) {
      // CUPDLP_FREE_VEC(iterates->y[0]);
      vec_clear(iterates->y[0]);
    }
    if (iterates->y[1]) {
      // CUPDLP_FREE_VEC(iterates->y[1]);
      vec_clear(iterates->y[1]);
    }
    if (iterates->xSum) {
      CUPDLP_FREE_VEC(iterates->xSum);
    }
    if (iterates->ySum) {
      CUPDLP_FREE_VEC(iterates->ySum);
    }
    if (iterates->xAverage) {
      // CUPDLP_FREE_VEC(iterates->xAverage);
      vec_clear(iterates->xAverage);
    }
    if (iterates->yAverage) {
      // CUPDLP_FREE_VEC(iterates->yAverage);
      vec_clear(iterates->yAverage);
    }
    if (iterates->xLastRestart) {
      CUPDLP_FREE_VEC(iterates->xLastRestart);
    }
    if (iterates->yLastRestart) {
      CUPDLP_FREE_VEC(iterates->yLastRestart);
    }
    if (iterates->ax[0]) {
      // CUPDLP_FREE_VEC(iterates->ax[0]);
      vec_clear(iterates->ax[0]);
    }
    if (iterates->ax[1]) {
      // CUPDLP_FREE_VEC(iterates->ax[1]);
      vec_clear(iterates->ax[1]);
    }
    if (iterates->axAverage) {
      // CUPDLP_FREE_VEC(iterates->axAverage);
      vec_clear(iterates->axAverage);
    }
    if (iterates->aty[0]) {
      // CUPDLP_FREE_VEC(iterates->aty[0]);
      vec_clear(iterates->aty[0]);
    }
    if (iterates->aty[1]) {
      // CUPDLP_FREE_VEC(iterates->aty[1]);
      vec_clear(iterates->aty[1]);
    }
    if (iterates->atyAverage) {
      // CUPDLP_FREE_VEC(iterates->atyAverage);
      vec_clear(iterates->atyAverage);
    }
    cupdlp_free(iterates);
  }
}